

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

Ptr priExpress(TokenReader *tokens)

{
  invalid_argument *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  undefined1 local_78 [8];
  Token token;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [4];
  
  *(undefined8 *)tokens = 0;
  *(undefined8 *)(tokens + 8) = 0;
  TokenReader::peek();
  if (local_78._0_4_ == NONE_TYPE) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"Invalid arguments, valid variable or literal is required!");
  }
  else {
    if ((uint)local_78._0_4_ < KEY_TYPE) {
      TokenReader::read();
      Token::operator=((Token *)local_78,(Token *)local_48);
      std::__cxx11::string::~string((string *)local_40);
      token.val.field_2._12_4_ = (local_78._0_4_ == ID_TYPE) + 1;
      std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
                ((ASTNodeType *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&token.val.field_2 + 0xc));
      std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,
                 (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
LAB_0010b21d:
      std::__cxx11::string::~string((string *)&token);
      PVar1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      PVar1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tokens;
      return (Ptr)PVar1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (local_78._0_4_ == LBRACKET_TYPE) {
      TokenReader::read();
      Token::operator=((Token *)local_78,(Token *)local_48);
      std::__cxx11::string::~string((string *)local_40);
      express((TokenReader *)local_48);
      std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,
                 (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
      TokenReader::read();
      Token::operator=((Token *)local_78,(Token *)local_48);
      std::__cxx11::string::~string((string *)local_40);
      if (local_78._0_4_ == RBRACKET_TYPE) goto LAB_0010b21d;
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Lack of right bracket \")\"");
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this,"Invalid arguments, valid variable or literal is required!");
    }
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static SimpleASTNode::Ptr priExpress(TokenReader& tokens)
{
    //std::cout << "in pri express" << std::endl;
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    //std::cout << "token type " << token.type << std::endl;
    if (!token.isEmpty()) {
        if (token.type == TokenType::ID_TYPE || token.type == TokenType::INT_LITERAL_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create((token.type == TokenType::ID_TYPE) ? ASTNodeType::ID :
                   ASTNodeType::INT_LITERAL,  token.val);
        } else if (token.type == TokenType::LBRACKET_TYPE) {
            token = tokens.read();
            node = express(tokens);
            token = tokens.read(); // consume the ")"
            if (token.isEmpty() || token.type != TokenType::RBRACKET_TYPE)
                throw std::invalid_argument("Lack of right bracket \")\"");
        } else {
            throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
        }
    } else {
        throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
    }
    return node;
}